

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void parse_source(Context_conflict *ctx,char *filename,char *source,uint sourcelen,
                 MOJOSHADER_preprocessorDefine *defines,uint define_count,
                 MOJOSHADER_includeOpen include_open,MOJOSHADER_includeClose include_close)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  Context_conflict *pCVar4;
  MOJOSHADER_astStructMembers *pMVar5;
  MOJOSHADER_free p_Var6;
  void *pvVar7;
  MOJOSHADER_astNodeType MVar8;
  bool bVar9;
  SymbolMap *map;
  SymbolScope *pSVar10;
  long lVar11;
  yyStackEntry *pyVar12;
  undefined8 uVar13;
  int iVar14;
  Preprocessor *_ctx;
  yyParser *yypParser;
  char *pcVar15;
  char *pcVar16;
  YYMINORTYPE YVar17;
  ushort *puVar18;
  MOJOSHADER_astExpression *pMVar19;
  YYMINORTYPE YVar20;
  MOJOSHADER_astScalarOrArray *pMVar21;
  MOJOSHADER_astStatement *pMVar22;
  YYMINORTYPE YVar23;
  MOJOSHADER_astNode *pMVar24;
  MOJOSHADER_astNode *pMVar25;
  MOJOSHADER_astDataType *pMVar26;
  uint uVar27;
  long *plVar28;
  ulong uVar29;
  MOJOSHADER_astAnnotations *annotations;
  MOJOSHADER_astExpression *pMVar30;
  MOJOSHADER_astStatement *pMVar31;
  MOJOSHADER_astFunctionParameters *params;
  MOJOSHADER_astExpression *initializer;
  ulong uVar32;
  ulong uVar33;
  Token yyMajor;
  MOJOSHADER_astInputModifier inputmod;
  MOJOSHADER_astVariableDeclaration *decl;
  MOJOSHADER_astPackOffset *po;
  MOJOSHADER_astFunctionSignature *declaration;
  ulong uVar34;
  MOJOSHADER_astStatement *pMVar35;
  MOJOSHADER_astInterpolationModifier interpmod;
  MOJOSHADER_astVariableLowLevel *vll;
  yyParser *pParser;
  bool bVar36;
  YYMINORTYPE local_90;
  YYMINORTYPE local_88;
  YYMINORTYPE local_80;
  YYMINORTYPE local_78;
  Token tokenval;
  uint tokenlen;
  undefined8 local_68;
  Preprocessor *local_60;
  yyStackEntry *local_58;
  YYMINORTYPE local_50;
  SymbolScope *local_48;
  SymbolMap *local_40;
  uint *local_38;
  
  if (include_open == (MOJOSHADER_includeOpen)0x0) {
    include_open = MOJOSHADER_internal_include_open;
  }
  if (include_close == (MOJOSHADER_includeClose)0x0) {
    include_close = MOJOSHADER_internal_include_close;
  }
  _ctx = preprocessor_start(filename,source,sourcelen,include_open,include_close,defines,
                            define_count,0,MallocBridge,FreeBridge,ctx);
  if (_ctx == (Preprocessor *)0x0) {
    if (ctx->out_of_memory != 0) {
      return;
    }
    __assert_fail("ctx->out_of_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x113a,
                  "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                 );
  }
  yypParser = (yyParser *)(*ctx->malloc)(0x650,ctx->malloc_data);
  if (yypParser == (yyParser *)0x0) {
    if (ctx->out_of_memory == 0) {
      __assert_fail("ctx->out_of_memory",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1141,
                    "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                   );
    }
    preprocessor_end(_ctx);
    return;
  }
  yypParser->yyidx = -1;
  init_builtins(ctx);
  local_40 = &ctx->usertypes;
  local_48 = (ctx->usertypes).scope;
  local_38 = &ctx->sourceline;
  local_58 = yypParser->yystack;
  local_68 = 0;
  bVar9 = false;
  local_60 = _ctx;
LAB_0011e6a9:
  pcVar15 = preprocessor_nexttoken(_ctx,&tokenlen,&tokenval);
  map = local_40;
  pSVar10 = local_48;
  if (ctx->out_of_memory == 0) {
    pcVar16 = preprocessor_sourcepos(_ctx,local_38);
    if (pcVar16 == (char *)0x0) {
      pcVar16 = (char *)0x0;
    }
    else {
      pcVar16 = stringcache(ctx->strcache,pcVar16);
    }
    uVar27 = tokenlen;
    ctx->sourcefile = pcVar16;
    if (tokenval - TOKEN_HASH < 2) {
      tokenval = TOKEN_BAD_CHARS;
LAB_0011e708:
      pcVar15 = "Bad characters in source file";
LAB_0011e712:
      fail(ctx,pcVar15);
      uVar13 = local_68;
      goto LAB_0011e717;
    }
    if (tokenval == 10) {
      bVar9 = false;
      bVar36 = (int)local_68 == 0;
      local_68 = 0;
      uVar13 = local_68;
      if (bVar36) {
        __assert_fail("is_pragma",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1175,
                      "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                     );
      }
      goto LAB_0011e717;
    }
    if (tokenval == TOKEN_PP_PRAGMA) {
      bVar9 = true;
      bVar36 = (int)local_68 != 0;
      local_68 = 1;
      uVar13 = 1;
      if (bVar36) {
        __assert_fail("!is_pragma",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x116d,
                      "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                     );
      }
      goto LAB_0011e717;
    }
    if (tokenval == TOKEN_PREPROCESSING_ERROR) goto LAB_0011e712;
    if (tokenval == TOKEN_BAD_CHARS) goto LAB_0011e708;
    if (bVar9) {
      bVar9 = true;
      uVar13 = local_68;
      goto LAB_0011e717;
    }
    if (0x1c < tokenval - TOKEN_IDENTIFIER) {
      yyMajor = tokenval;
      switch(tokenval) {
      case 0x21:
      case 0x28:
      case 0x29:
        break;
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x27:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        goto switchD_0011e7a4_caseD_119;
      case 0x25:
        yyMajor = 0x1f;
        break;
      case 0x26:
        yyMajor = 0x12;
        break;
      case 0x2a:
        yyMajor = 0x1d;
        break;
      case 0x2b:
        yyMajor = 0x1b;
        break;
      case 0x2c:
        yyMajor = 1;
        break;
      case 0x2d:
        yyMajor = 0x1c;
        break;
      case 0x2e:
        yyMajor = 0x25;
        break;
      case 0x2f:
        yyMajor = 0x1e;
        break;
      case 0x3a:
        yyMajor = 0x35;
        break;
      case 0x3b:
        yyMajor = 0x2b;
        break;
      case 0x3c:
        yyMajor = 0x15;
        break;
      case 0x3d:
        yyMajor = 2;
        break;
      case 0x3e:
        yyMajor = 0x17;
        break;
      case 0x3f:
        yyMajor = 0xd;
        break;
      default:
        switch(tokenval) {
        case 0x7b:
          yyMajor = 0x41;
          break;
        case 0x7c:
          yyMajor = 0x10;
          break;
        case 0x7d:
          yyMajor = 0x42;
          break;
        case 0x7e:
          yyMajor = 0x22;
          break;
        default:
          if (tokenval == 0x5b) {
            yyMajor = 0x26;
          }
          else if (tokenval == 0x5d) {
            yyMajor = 0x27;
          }
          else {
            if (tokenval != 0x5e) goto switchD_0011e7a4_caseD_119;
            yyMajor = 0x11;
          }
        }
      }
      goto switchD_0011e807_caseD_21;
    }
    uVar29 = (ulong)tokenlen;
    switch(tokenval) {
    case TOKEN_IDENTIFIER:
      switch(tokenlen) {
      case 2:
        if ((short)*(long *)pcVar15 == 0x6e69) {
          yyMajor = 0x31;
        }
        else if ((short)*(long *)pcVar15 == 0x6f64) {
          yyMajor = 0x65;
        }
        else {
          if ((short)*(long *)pcVar15 != 0x6669) goto switchD_0011e7c1_caseD_e;
          yyMajor = 0x6c;
        }
        break;
      case 3:
        iVar14 = bcmp(pcVar15,"out",3);
        if (iVar14 == 0) {
          yyMajor = 0x33;
        }
        else {
          iVar14 = bcmp(pcVar15,"int",3);
          if (iVar14 == 0) {
            yyMajor = 0x50;
          }
          else {
            iVar14 = bcmp(pcVar15,"for",3);
            if (iVar14 == 0) {
              yyMajor = 0x6a;
            }
            else {
              iVar14 = bcmp(pcVar15,"xps",3);
              if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
              yyMajor = 0x61;
            }
          }
        }
        break;
      case 4:
        if ((int)*(long *)pcVar15 == 0x65736c65) {
          yyMajor = 0x2a;
        }
        else if ((int)*(long *)pcVar15 == 0x64696f76) {
          yyMajor = 0x2f;
        }
        else if ((int)*(long *)pcVar15 == 0x6c6f6f62) {
          yyMajor = 0x4f;
        }
        else if ((int)*(long *)pcVar15 == 0x746e6975) {
          yyMajor = 0x51;
        }
        else if ((int)*(long *)pcVar15 == 0x666c6168) {
          yyMajor = 0x52;
        }
        else if ((int)*(long *)pcVar15 == 0x706f6f6c) {
          yyMajor = 0x69;
        }
        else if ((int)*(long *)pcVar15 == 0x6c6c6163) {
          yyMajor = 0x74;
        }
        else if ((int)*(long *)pcVar15 == 0x65736163) {
          yyMajor = 0x75;
        }
        else {
          if ((int)*(long *)pcVar15 != 0x65757274) goto switchD_0011e7c1_caseD_e;
          yyMajor = 0x79;
        }
        break;
      case 5:
        iVar14 = bcmp(pcVar15,"inout",5);
        if (iVar14 == 0) {
          yyMajor = 0x32;
        }
        else {
          iVar14 = bcmp(pcVar15,"const",5);
          if (iVar14 == 0) {
            yyMajor = 0x2d;
          }
          else {
            iVar14 = bcmp(pcVar15,"float",5);
            if (iVar14 == 0) {
              yyMajor = 0x53;
            }
            else {
              iVar14 = bcmp(pcVar15,"snorm",5);
              if (iVar14 == 0) {
                yyMajor = 0x56;
              }
              else {
                iVar14 = bcmp(pcVar15,"unorm",5);
                if (iVar14 == 0) {
                  yyMajor = 0x57;
                }
                else {
                  iVar14 = bcmp(pcVar15,"break",5);
                  if (iVar14 == 0) {
                    yyMajor = 0x62;
                  }
                  else {
                    iVar14 = bcmp(pcVar15,"while",5);
                    if (iVar14 == 0) {
                      yyMajor = 0x66;
                    }
                    else {
                      iVar14 = bcmp(pcVar15,"false",5);
                      if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
                      yyMajor = 0x7a;
                    }
                  }
                }
              }
            }
          }
        }
        break;
      case 6:
        iVar14 = bcmp(pcVar15,"inline",6);
        if (iVar14 == 0) {
          yyMajor = 0x30;
        }
        else {
          iVar14 = bcmp(pcVar15,"linear",6);
          if (iVar14 == 0) {
            yyMajor = 0x36;
          }
          else {
            iVar14 = bcmp(pcVar15,"sample",6);
            if (iVar14 == 0) {
              yyMajor = 0x3a;
            }
            else {
              iVar14 = bcmp(pcVar15,"struct",6);
              if (iVar14 == 0) {
                yyMajor = 0x43;
              }
              else {
                iVar14 = bcmp(pcVar15,"extern",6);
                if (iVar14 == 0) {
                  yyMajor = 0x3b;
                }
                else {
                  iVar14 = bcmp(pcVar15,"shared",6);
                  if (iVar14 == 0) {
                    yyMajor = 0x3c;
                  }
                  else {
                    iVar14 = bcmp(pcVar15,"static",6);
                    if (iVar14 == 0) {
                      yyMajor = 0x3d;
                    }
                    else {
                      iVar14 = bcmp(pcVar15,"double",6);
                      if (iVar14 == 0) {
                        yyMajor = 0x54;
                      }
                      else {
                        iVar14 = bcmp(pcVar15,"string",6);
                        if (iVar14 == 0) {
                          yyMajor = 0x55;
                        }
                        else {
                          iVar14 = bcmp(pcVar15,"buffer",6);
                          if (iVar14 == 0) {
                            yyMajor = 0x58;
                          }
                          else {
                            iVar14 = bcmp(pcVar15,"vector",6);
                            if (iVar14 == 0) {
                              yyMajor = 0x59;
                            }
                            else {
                              iVar14 = bcmp(pcVar15,"matrix",6);
                              if (iVar14 == 0) {
                                yyMajor = 0x5b;
                              }
                              else {
                                iVar14 = bcmp(pcVar15,"return",6);
                                if (iVar14 == 0) {
                                  yyMajor = 0x67;
                                }
                                else {
                                  iVar14 = bcmp(pcVar15,"unroll",6);
                                  if (iVar14 == 0) {
                                    yyMajor = 0x68;
                                  }
                                  else {
                                    iVar14 = bcmp(pcVar15,"branch",6);
                                    if (iVar14 == 0) {
                                      yyMajor = 0x6b;
                                    }
                                    else {
                                      iVar14 = bcmp(pcVar15,"switch",6);
                                      if (iVar14 == 0) {
                                        yyMajor = 0x72;
                                      }
                                      else {
                                        iVar14 = bcmp(pcVar15,"unused",6);
                                        if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
                                        yyMajor = 0x60;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        break;
      case 7:
        iVar14 = bcmp(pcVar15,"uniform",7);
        if (iVar14 == 0) {
          yyMajor = 0x34;
        }
        else {
          iVar14 = bcmp(pcVar15,"typedef",7);
          if (iVar14 == 0) {
            yyMajor = 0x2c;
          }
          else {
            iVar14 = bcmp(pcVar15,"discard",7);
            if (iVar14 == 0) {
              yyMajor = 100;
            }
            else {
              iVar14 = bcmp(pcVar15,"flatten",7);
              if (iVar14 == 0) {
                yyMajor = 0x6d;
              }
              else {
                iVar14 = bcmp(pcVar15,"default",7);
                if (iVar14 == 0) {
                  yyMajor = 0x76;
                }
                else {
                  iVar14 = bcmp(pcVar15,"sampler",7);
                  if (iVar14 == 0) {
                    yyMajor = 0x47;
                  }
                  else {
                    iVar14 = bcmp(pcVar15,"isolate",7);
                    if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
                    yyMajor = 0x5c;
                  }
                }
              }
            }
          }
        }
        break;
      case 8:
        if (*(long *)pcVar15 == 0x64696f72746e6563) {
          yyMajor = 0x37;
        }
        else if (*(long *)pcVar15 == 0x7265747369676572) {
          yyMajor = 0x45;
        }
        else if (*(long *)pcVar15 == 0x656c6974616c6f76) {
          yyMajor = 0x3e;
        }
        else {
          if (*(long *)pcVar15 != 0x65756e69746e6f63) goto switchD_0011e7c1_caseD_e;
          yyMajor = 99;
        }
        break;
      case 9:
        iVar14 = bcmp(pcVar15,"row_major",9);
        if (iVar14 == 0) {
          yyMajor = 0x3f;
        }
        else {
          iVar14 = bcmp(pcVar15,"forcecase",9);
          if (iVar14 == 0) {
            yyMajor = 0x73;
          }
          else {
            iVar14 = bcmp(pcVar15,"sampler1D",9);
            if (iVar14 == 0) {
              yyMajor = 0x48;
            }
            else {
              iVar14 = bcmp(pcVar15,"sampler2D",9);
              if (iVar14 == 0) {
                yyMajor = 0x49;
              }
              else {
                iVar14 = bcmp(pcVar15,"sampler3D",9);
                if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
                yyMajor = 0x4a;
              }
            }
          }
        }
        break;
      case 10:
        iVar14 = bcmp(pcVar15,"packoffset",10);
        if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
        yyMajor = 0x44;
        break;
      case 0xb:
        iVar14 = bcmp(pcVar15,"samplerCUBE",0xb);
        if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
        yyMajor = 0x4b;
        break;
      case 0xc:
        iVar14 = bcmp(pcVar15,"column_major",0xc);
        if (iVar14 == 0) {
          yyMajor = 0x40;
        }
        else {
          iVar14 = bcmp(pcVar15,"SamplerState",0xc);
          if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
          yyMajor = 0x4d;
        }
        break;
      case 0xd:
        iVar14 = bcmp(pcVar15,"noperspective",0xd);
        if (iVar14 == 0) {
          yyMajor = 0x39;
        }
        else {
          iVar14 = bcmp(pcVar15,"sampler_state",0xd);
          if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
          yyMajor = 0x4c;
        }
        break;
      default:
switchD_0011e7c1_caseD_e:
        pcVar16 = stringcache_len(ctx->strcache,pcVar15,uVar27);
        pMVar26 = get_usertype(ctx,pcVar16);
        if (pMVar26 == (MOJOSHADER_astDataType *)0x0) {
          yyMajor = 0x2e;
          goto LAB_0011e8fc;
        }
        pcVar15 = stringcache_len(ctx->strcache,pcVar15,tokenlen);
        YVar17.yy37 = get_usertype(ctx,pcVar15);
        if ((MOJOSHADER_astDataType *)YVar17.yy8 == (MOJOSHADER_astDataType *)0x0) {
          __assert_fail("data.datatype != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x118f,
                        "void parse_source(Context *, const char *, const char *, unsigned int, const MOJOSHADER_preprocessorDefine *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose)"
                       );
        }
        yyMajor = 0x46;
        goto LAB_0011e96d;
      case 0xf:
        iVar14 = bcmp(pcVar15,"nointerpolation",0xf);
        if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
        yyMajor = 0x38;
        break;
      case 0x13:
        iVar14 = bcmp(pcVar15,"maxInstructionCount",0x13);
        if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
        yyMajor = 0x5d;
        break;
      case 0x16:
        iVar14 = bcmp(pcVar15,"SamplerComparisonState",0x16);
        if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
        yyMajor = 0x4e;
        break;
      case 0x19:
        iVar14 = bcmp(pcVar15,"noExpressionOptimizations",0x19);
        if (iVar14 != 0) goto switchD_0011e7c1_caseD_e;
        yyMajor = 0x5e;
      }
      break;
    case TOKEN_INT_LITERAL:
      plVar28 = (long *)((long)pcVar15 + uVar29);
      while( true ) {
        iVar14 = (int)uVar29;
        uVar34 = 1;
        if (iVar14 == 0) break;
        if ((char)*(long *)pcVar15 != ' ') {
          if ((char)*(long *)pcVar15 == '-') {
            pcVar15 = (char *)((long)pcVar15 + 1);
            uVar29 = (ulong)(iVar14 - 1);
            uVar34 = 0xffffffffffffffff;
          }
          goto LAB_00120174;
        }
        pcVar15 = (char *)((long)pcVar15 + 1);
        uVar29 = (ulong)(iVar14 - 1);
      }
      uVar29 = 0;
      pcVar15 = (char *)plVar28;
LAB_00120174:
      uVar32 = 0xffffffffffffffff;
      do {
        uVar33 = uVar29;
        if (uVar32 - uVar29 == -1) break;
        lVar11 = uVar32 + 1;
        uVar33 = uVar32 + 1;
        uVar32 = uVar33;
      } while (0xf5 < (byte)(*(char *)((long)pcVar15 + lVar11) - 0x3aU));
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)0x0;
      for (; 0 < (int)uVar33; uVar33 = uVar33 - 1) {
        YVar17.yy8 = (MOJOSHADER_astPackOffset *)
                     ((long)&((YVar17.yy8)->ast).type +
                     ((long)*(char *)((long)pcVar15 + (uVar33 - 1)) + -0x30) * uVar34);
        uVar34 = uVar34 * 10;
      }
      yyMajor = 0x5a;
      goto LAB_0011e96d;
    case TOKEN_FLOAT_LITERAL:
      YVar17 = (YYMINORTYPE)strtodouble(pcVar15,tokenlen);
      yyMajor = 0x77;
      goto LAB_0011e96d;
    case TOKEN_STRING_LITERAL:
      yyMajor = 0x78;
LAB_0011e8fc:
      YVar17.yy306 = stringcache_len(ctx->strcache,pcVar15,tokenlen);
      goto LAB_0011e96d;
    case TOKEN_RSHIFTASSIGN:
      yyMajor = 9;
      break;
    case TOKEN_LSHIFTASSIGN:
      yyMajor = 8;
      break;
    case TOKEN_ADDASSIGN:
      yyMajor = 3;
      break;
    case TOKEN_SUBASSIGN:
      yyMajor = 4;
      break;
    case TOKEN_MULTASSIGN:
      yyMajor = 5;
      break;
    case TOKEN_DIVASSIGN:
      yyMajor = 6;
      break;
    case TOKEN_MODASSIGN:
      yyMajor = 7;
      break;
    case TOKEN_XORASSIGN:
      yyMajor = 0xc;
      break;
    case TOKEN_ANDASSIGN:
      yyMajor = 10;
      break;
    case TOKEN_ORASSIGN:
      yyMajor = 0xb;
      break;
    case TOKEN_INCREMENT:
      yyMajor = 0x24;
      break;
    case TOKEN_DECREMENT:
      yyMajor = 0x23;
      break;
    case TOKEN_RSHIFT:
      yyMajor = 0x1a;
      break;
    case TOKEN_LSHIFT:
      yyMajor = 0x19;
      break;
    case TOKEN_ANDAND:
      yyMajor = 0xf;
      break;
    case TOKEN_OROR:
      yyMajor = 0xe;
      break;
    case TOKEN_LEQ:
      yyMajor = 0x16;
      break;
    case TOKEN_GEQ:
      yyMajor = 0x18;
      break;
    case TOKEN_EQL:
      yyMajor = 0x13;
      break;
    case TOKEN_NEQ:
      yyMajor = 0x14;
      break;
    default:
switchD_0011e7a4_caseD_119:
      __assert_fail("0 && \"unexpected token from lexer\\n\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0xdd5,
                    "int convert_to_lemon_token(Context *, const char *, unsigned int, const Token)"
                   );
    case TOKEN_EOI:
      yyMajor = 0;
    }
switchD_0011e807_caseD_21:
    YVar17.yy8 = (MOJOSHADER_astPackOffset *)0x0;
LAB_0011e96d:
    uVar27 = yypParser->yyidx;
    if ((int)uVar27 < 0) {
      yypParser->yyidx = 0;
      yypParser->yyerrcnt = -1;
      yypParser->yystack[0].stateno = 0;
      yypParser->yystack[0].major = '\0';
      uVar27 = 0;
    }
    yypParser->ctx = ctx;
    local_50 = YVar17;
LAB_0011e997:
    pyVar12 = local_58;
    _ctx = local_60;
    uVar34 = (ulong)uVar27;
    uVar29 = (ulong)local_58[uVar34].stateno;
    puVar18 = yy_default + uVar29;
    if (((uVar29 < 0x129) && (uVar27 = (int)yy_shift_ofst[uVar29] + yyMajor, uVar27 < 0x151f)) &&
       (yy_lookahead[uVar27] == (uchar)yyMajor)) {
      puVar18 = yy_action + uVar27;
    }
    uVar3 = *puVar18;
    if (uVar3 < 0x20d) {
      if (yyMajor == 0) {
        __assert_fail("!yyendofinput",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                      ,0x1046,"void ParseHLSL(void *, int, TokenData, Context *)");
      }
      yy_shift(yypParser,(uint)uVar3,yyMajor,&local_50);
      yypParser->yyerrcnt = yypParser->yyerrcnt + -1;
      _ctx = local_60;
      goto LAB_00120133;
    }
    uVar27 = (uint)uVar3;
    if (0x32c < uVar3) {
      if (uVar27 != 0x32d) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                      ,0x104d,"void ParseHLSL(void *, int, TokenData, Context *)");
      }
      if (yypParser->yyerrcnt < 1) {
        pCVar4 = yypParser->ctx;
        fail(pCVar4,"Syntax error");
        yypParser->ctx = pCVar4;
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(uchar)yyMajor,&local_50);
      if (yyMajor == 0) {
        pCVar4 = yypParser->ctx;
        while (-1 < yypParser->yyidx) {
          yy_pop_parser_stack(yypParser);
        }
        fail(pCVar4,"Giving up. Parser is hopelessly lost...");
        yypParser->ctx = pCVar4;
      }
      goto LAB_00120133;
    }
    pCVar4 = yypParser->ctx;
    local_90.yy8 = (MOJOSHADER_astPackOffset *)0x0;
    YVar17.yy8 = local_90.yy8;
    switch(uVar27) {
    case 0x20d:
      if (pCVar4->ast != (MOJOSHADER_astNode *)0x0) {
        __assert_fail("ctx->ast == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.lemon"
                      ,0x4e,"void yy_reduce(yyParser *, int)");
      }
      pMVar25 = (MOJOSHADER_astNode *)local_58[uVar34].minor.yy8;
      if (pMVar25 == (MOJOSHADER_astNode *)0x0) {
        pMVar25 = (MOJOSHADER_astNode *)0x0;
      }
      else if ((pMVar25->expression).datatype != (MOJOSHADER_astDataType *)0x0) {
        pMVar24 = (MOJOSHADER_astNode *)0x0;
        while (pMVar25 != (MOJOSHADER_astNode *)0x0) {
          local_58[uVar34].minor = (YYMINORTYPE)(pMVar25->expression).datatype;
          (pMVar25->expression).datatype = (MOJOSHADER_astDataType *)pMVar24;
          pMVar24 = pMVar25;
          pMVar25 = (MOJOSHADER_astNode *)local_58[uVar34].minor.yy8;
        }
        local_58[uVar34].minor.yy8 = (MOJOSHADER_astPackOffset *)pMVar24;
        pMVar25 = pMVar24;
      }
      pCVar4->ast = pMVar25;
      break;
    default:
      goto switchD_0011ea2c_caseD_20e;
    case 0x20f:
      if (local_58[uVar34].minor.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        (local_58[uVar34].minor.yy8)->ident1 = (char *)local_58[uVar34 - 1].minor;
        goto switchD_0011ea2c_caseD_20e;
      }
      break;
    case 0x210:
      local_88 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x40;
LAB_0011fc52:
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)0x0;
        YVar23 = local_88;
LAB_0011fc6d:
        *(YYMINORTYPE *)&(YVar17.yy8)->ident2 = YVar23;
      }
      break;
    case 0x211:
      declaration = local_58[uVar34 - 1].minor.yy364;
      pMVar31 = (MOJOSHADER_astStatement *)0x0;
      goto LAB_0011fdb8;
    case 0x212:
      declaration = local_58[uVar34 - 1].minor.yy364;
      pMVar31 = local_58[uVar34].minor.yy233;
LAB_0011fdb8:
      YVar17.yy139 = new_function(pCVar4,declaration,pMVar31);
      break;
    case 0x213:
      local_88 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x3e;
        goto LAB_0011fc52;
      }
      break;
    case 0x214:
      local_88 = local_58[uVar34 - 1].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x3f;
        goto LAB_0011fc52;
      }
      break;
    case 0x215:
      pMVar26 = local_58[uVar34 - 1].minor.yy37;
      pMVar21 = local_58[uVar34].minor.yy380;
      iVar14 = 1;
      goto LAB_0011fdd0;
    case 0x216:
      pMVar26 = local_58[uVar34 - 1].minor.yy37;
      pMVar21 = local_58[uVar34].minor.yy380;
      iVar14 = 0;
LAB_0011fdd0:
      local_90.yy71 = new_typedef(pCVar4,iVar14,pMVar26,pMVar21);
      YVar17 = (YYMINORTYPE)(pyVar12[uVar34].minor.yy8)->ident1;
      pMVar26 = (local_90.yy71)->datatype;
LAB_0011fde6:
      push_usertype(pCVar4,YVar17.yy306,pMVar26);
      YVar17 = local_90;
      break;
    case 0x217:
      YVar17 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy346;
      (YVar17.yy346)->interpolation_mod = local_58[uVar34 - 2].minor.yyinit;
      goto LAB_0011fce9;
    case 0x218:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy346;
      (YVar17.yy346)->interpolation_mod = local_58[uVar34 - 1].minor.yyinit;
      break;
    case 0x219:
      YVar17 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy24;
LAB_0011fce9:
      (YVar17.yy24)->semantic = (char *)local_58[uVar34].minor;
      break;
    case 0x21b:
      pMVar26 = local_58[uVar34 - 4].minor.yy37;
      pcVar15 = local_58[uVar34 - 3].minor.yy306;
      params = local_58[uVar34 - 1].minor.yy307;
      goto LAB_0011fe02;
    case 0x21c:
      pcVar15 = local_58[uVar34 - 3].minor.yy306;
      params = local_58[uVar34 - 1].minor.yy307;
      pMVar26 = (MOJOSHADER_astDataType *)0x0;
LAB_0011fe02:
      YVar17.yy364 = new_function_signature(pCVar4,pMVar26,pcVar15,params);
      break;
    case 0x21d:
    case 0x233:
    case 0x23a:
    case 0x244:
    case 0x2d4:
    case 0x2db:
      local_90 = (YYMINORTYPE)0x1;
      YVar17 = local_90;
      break;
    case 0x21e:
    case 0x220:
    case 0x2f4:
      local_90.yy8 = (MOJOSHADER_astPackOffset *)0x0;
      YVar17.yy8 = local_90.yy8;
      break;
    case 0x21f:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy24;
      if (YVar17.yy8 == (MOJOSHADER_astPackOffset *)0x0) {
LAB_0011f811:
        YVar17.yy8 = (MOJOSHADER_astPackOffset *)0x0;
      }
      else if ((YVar17.yy24)->initializer != (MOJOSHADER_astExpression *)0x0) {
        YVar23.yy8 = (MOJOSHADER_astPackOffset *)0x0;
        while (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
          local_58[uVar34].minor = (YYMINORTYPE)(YVar17.yy24)->initializer;
          (YVar17.yy24)->initializer = (MOJOSHADER_astExpression *)YVar23;
          YVar23 = YVar17;
          YVar17.yy24 = local_58[uVar34].minor.yy24;
        }
        local_58[uVar34].minor.yy8 = (MOJOSHADER_astPackOffset *)YVar23;
        YVar17 = YVar23;
      }
      break;
    case 0x222:
      (local_58[uVar34].minor.yy24)->initializer =
           (MOJOSHADER_astExpression *)local_58[uVar34 - 2].minor;
      goto switchD_0011ea2c_caseD_20e;
    case 0x223:
      inputmod = local_58[uVar34 - 5].minor.yy75;
      pMVar26 = local_58[uVar34 - 4].minor.yy37;
      pcVar15 = local_58[uVar34 - 3].minor.yy306;
      pcVar16 = local_58[uVar34 - 2].minor.yy306;
      interpmod = local_58[uVar34 - 1].minor.yy111;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fda3;
    case 0x224:
      inputmod = local_58[uVar34 - 4].minor.yy75;
      pMVar26 = local_58[uVar34 - 3].minor.yy37;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      pcVar16 = local_58[uVar34 - 1].minor.yy306;
      interpmod = local_58[uVar34].minor.yy111;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011fda3;
    case 0x225:
      inputmod = local_58[uVar34 - 4].minor.yy75;
      pMVar26 = local_58[uVar34 - 3].minor.yy37;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      pcVar16 = local_58[uVar34 - 1].minor.yy306;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fd23;
    case 0x226:
      inputmod = local_58[uVar34 - 3].minor.yy75;
      pMVar26 = local_58[uVar34 - 2].minor.yy37;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      pcVar16 = local_58[uVar34].minor.yy306;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011fd23;
    case 0x227:
      inputmod = local_58[uVar34 - 4].minor.yy75;
      pMVar26 = local_58[uVar34 - 3].minor.yy37;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      interpmod = local_58[uVar34 - 1].minor.yy111;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fcc0;
    case 0x228:
      inputmod = local_58[uVar34 - 3].minor.yy75;
      pMVar26 = local_58[uVar34 - 2].minor.yy37;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      interpmod = local_58[uVar34].minor.yy111;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011fcc0;
    case 0x229:
      inputmod = local_58[uVar34 - 3].minor.yy75;
      pMVar26 = local_58[uVar34 - 2].minor.yy37;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fca0;
    case 0x22a:
      inputmod = local_58[uVar34 - 2].minor.yy75;
      pMVar26 = local_58[uVar34 - 1].minor.yy37;
      pcVar15 = local_58[uVar34].minor.yy306;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011fca0;
    case 0x22b:
      pMVar26 = local_58[uVar34 - 4].minor.yy37;
      pcVar15 = local_58[uVar34 - 3].minor.yy306;
      pcVar16 = local_58[uVar34 - 2].minor.yy306;
      interpmod = local_58[uVar34 - 1].minor.yy111;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fd9e;
    case 0x22c:
      pMVar26 = local_58[uVar34 - 3].minor.yy37;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      pcVar16 = local_58[uVar34 - 1].minor.yy306;
      interpmod = local_58[uVar34].minor.yy111;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
LAB_0011fd9e:
      inputmod = MOJOSHADER_AST_INPUTMOD_NONE;
      goto LAB_0011fda3;
    case 0x22d:
      pMVar26 = local_58[uVar34 - 3].minor.yy37;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      pcVar16 = local_58[uVar34 - 1].minor.yy306;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fa9a;
    case 0x22e:
      pMVar26 = local_58[uVar34 - 2].minor.yy37;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      pcVar16 = local_58[uVar34].minor.yy306;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
LAB_0011fa9a:
      inputmod = MOJOSHADER_AST_INPUTMOD_NONE;
      goto LAB_0011fd23;
    case 0x22f:
      pMVar26 = local_58[uVar34 - 3].minor.yy37;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      interpmod = local_58[uVar34 - 1].minor.yy111;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fa7c;
    case 0x230:
      pMVar26 = local_58[uVar34 - 2].minor.yy37;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      interpmod = local_58[uVar34].minor.yy111;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
LAB_0011fa7c:
      inputmod = MOJOSHADER_AST_INPUTMOD_NONE;
LAB_0011fcc0:
      pcVar16 = (char *)0x0;
      goto LAB_0011fda3;
    case 0x231:
      pMVar26 = local_58[uVar34 - 2].minor.yy37;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fb7f;
    case 0x232:
      pMVar26 = local_58[uVar34 - 1].minor.yy37;
      pcVar15 = local_58[uVar34].minor.yy306;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
LAB_0011fb7f:
      inputmod = MOJOSHADER_AST_INPUTMOD_NONE;
LAB_0011fca0:
      pcVar16 = (char *)0x0;
LAB_0011fd23:
      interpmod = MOJOSHADER_AST_INTERPMOD_NONE;
LAB_0011fda3:
      YVar17.yy307 = new_function_param(pCVar4,inputmod,pMVar26,pcVar15,pcVar16,interpmod,pMVar19);
      break;
    case 0x234:
    case 0x236:
    case 0x237:
    case 0x23c:
    case 0x2d6:
    case 0x2dd:
      local_90 = (YYMINORTYPE)0x3;
      YVar17 = local_90;
      break;
    case 0x235:
    case 0x23b:
    case 0x245:
    case 0x2d5:
    case 0x2dc:
      local_90 = (YYMINORTYPE)0x2;
      YVar17 = local_90;
      break;
    case 0x238:
    case 0x23d:
    case 0x246:
    case 0x2d7:
    case 0x2de:
      local_90 = (YYMINORTYPE)0x4;
      YVar17 = local_90;
      break;
    case 0x23e:
    case 0x2d8:
      local_90 = (YYMINORTYPE)0x5;
      YVar17 = local_90;
      break;
    case 0x23f:
      local_90 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy24;
      if ((local_90.yy24)->next != (MOJOSHADER_astVariableDeclaration *)0x0) {
        YVar17.yy8 = (MOJOSHADER_astPackOffset *)0x0;
        while (local_90.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
          local_58[uVar34 - 1].minor = (YYMINORTYPE)(local_90.yy24)->next;
          (local_90.yy24)->next = (MOJOSHADER_astVariableDeclaration *)YVar17;
          YVar17 = local_90;
          local_90.yy24 = local_58[uVar34 - 1].minor.yy24;
        }
        local_58[uVar34 - 1].minor.yy24 = (MOJOSHADER_astVariableDeclaration *)YVar17;
        local_90 = YVar17;
      }
      (local_90.yy24)->attributes = local_58[uVar34 - 3].minor.yyinit;
      goto LAB_0011fe9f;
    case 0x240:
      local_90 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy24;
      if ((local_90.yy24)->next != (MOJOSHADER_astVariableDeclaration *)0x0) {
        YVar17.yy8 = (MOJOSHADER_astPackOffset *)0x0;
        while (local_90.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
          local_58[uVar34 - 1].minor = (YYMINORTYPE)(local_90.yy24)->next;
          (local_90.yy24)->next = (MOJOSHADER_astVariableDeclaration *)YVar17;
          YVar17 = local_90;
          local_90.yy24 = local_58[uVar34 - 1].minor.yy24;
        }
        local_58[uVar34 - 1].minor.yy8 = (MOJOSHADER_astPackOffset *)YVar17;
        local_90 = YVar17;
      }
      goto LAB_0011fe9f;
    case 0x241:
      YVar17 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy24;
      if ((YVar17.yy24)->next != (MOJOSHADER_astVariableDeclaration *)0x0) {
        YVar23.yy8 = (MOJOSHADER_astPackOffset *)0x0;
        while (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
          local_58[uVar34 - 1].minor = (YYMINORTYPE)(YVar17.yy24)->next;
          (YVar17.yy24)->next = (MOJOSHADER_astVariableDeclaration *)YVar23;
          YVar23 = YVar17;
          YVar17.yy24 = local_58[uVar34 - 1].minor.yy24;
        }
        local_58[uVar34 - 1].minor.yy24 = (MOJOSHADER_astVariableDeclaration *)YVar23;
        YVar17 = YVar23;
      }
      YVar23 = local_58[uVar34 - 2].minor;
      goto LAB_0011fecd;
    case 0x242:
      local_90.yyinit = local_58[uVar34].minor.yy75;
      goto LAB_0011ed05;
    case 0x243:
      local_90.yy75 = local_58[uVar34].minor.yy75 | local_58[uVar34 - 1].minor.yy75;
LAB_0011ed05:
      local_90._4_4_ = 0;
      YVar17 = local_90;
      break;
    case 0x247:
      local_90 = (YYMINORTYPE)0x8;
      YVar17 = local_90;
      break;
    case 0x248:
      local_90 = (YYMINORTYPE)0x10;
      YVar17 = local_90;
      break;
    case 0x249:
      local_90 = (YYMINORTYPE)0x20;
      YVar17 = local_90;
      break;
    case 0x24a:
      local_90 = (YYMINORTYPE)0x40;
      YVar17 = local_90;
      break;
    case 0x24b:
      local_90 = (YYMINORTYPE)0x80;
      YVar17 = local_90;
      break;
    case 0x24c:
      local_90 = (YYMINORTYPE)0x100;
      YVar17 = local_90;
      break;
    case 0x24e:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy24;
      (YVar17.yy24)->next = (MOJOSHADER_astVariableDeclaration *)local_58[uVar34 - 2].minor;
      break;
    case 0x24f:
      pMVar21 = local_58[uVar34 - 4].minor.yy380;
      pcVar15 = local_58[uVar34 - 3].minor.yy306;
      annotations = local_58[uVar34 - 2].minor.yy268;
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
      vll = local_58[uVar34].minor.yy82;
      goto LAB_0011fc02;
    case 0x250:
      pMVar21 = local_58[uVar34 - 3].minor.yy380;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      annotations = local_58[uVar34 - 1].minor.yy268;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011fa4b;
    case 0x251:
      pMVar21 = local_58[uVar34 - 3].minor.yy380;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      annotations = local_58[uVar34 - 1].minor.yy268;
      vll = local_58[uVar34].minor.yy82;
      goto LAB_0011fbff;
    case 0x252:
      pMVar21 = local_58[uVar34 - 2].minor.yy380;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      annotations = local_58[uVar34].minor.yy268;
      goto LAB_0011fa48;
    case 0x253:
      pMVar21 = local_58[uVar34 - 3].minor.yy380;
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
      vll = local_58[uVar34].minor.yy82;
      goto LAB_0011fbea;
    case 0x254:
      pMVar21 = local_58[uVar34 - 2].minor.yy380;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      pMVar19 = local_58[uVar34].minor.yy322;
      goto LAB_0011f331;
    case 0x255:
      pMVar21 = local_58[uVar34 - 2].minor.yy380;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      vll = local_58[uVar34].minor.yy82;
      goto LAB_0011f9af;
    case 0x256:
      pMVar21 = local_58[uVar34 - 1].minor.yy380;
      pcVar15 = local_58[uVar34].minor.yy306;
      goto LAB_0011ed8b;
    case 599:
      pMVar21 = local_58[uVar34 - 3].minor.yy380;
      annotations = local_58[uVar34 - 2].minor.yy268;
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
      vll = local_58[uVar34].minor.yy82;
      pcVar15 = (char *)0x0;
      goto LAB_0011fc02;
    case 600:
      pMVar21 = local_58[uVar34 - 2].minor.yy380;
      annotations = local_58[uVar34 - 1].minor.yy268;
      pMVar19 = local_58[uVar34].minor.yy322;
      pcVar15 = (char *)0x0;
      goto LAB_0011fa4b;
    case 0x259:
      pMVar21 = local_58[uVar34 - 2].minor.yy380;
      annotations = local_58[uVar34 - 1].minor.yy268;
      vll = local_58[uVar34].minor.yy82;
      pcVar15 = (char *)0x0;
      goto LAB_0011fbff;
    case 0x25a:
      pMVar21 = local_58[uVar34 - 1].minor.yy380;
      annotations = local_58[uVar34].minor.yy268;
      pcVar15 = (char *)0x0;
      goto LAB_0011fa48;
    case 0x25b:
      pMVar21 = local_58[uVar34 - 2].minor.yy380;
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
      vll = local_58[uVar34].minor.yy82;
      pcVar15 = (char *)0x0;
LAB_0011fbea:
      annotations = (MOJOSHADER_astAnnotations *)0x0;
      goto LAB_0011fc02;
    case 0x25c:
      pMVar21 = local_58[uVar34 - 1].minor.yy380;
      pMVar19 = local_58[uVar34].minor.yy322;
      pcVar15 = (char *)0x0;
LAB_0011f331:
      annotations = (MOJOSHADER_astAnnotations *)0x0;
      goto LAB_0011fa4b;
    case 0x25d:
      pMVar21 = local_58[uVar34 - 1].minor.yy380;
      vll = local_58[uVar34].minor.yy82;
      pcVar15 = (char *)0x0;
LAB_0011f9af:
      annotations = (MOJOSHADER_astAnnotations *)0x0;
LAB_0011fbff:
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011fc02;
    case 0x25e:
      pMVar21 = local_58[uVar34].minor.yy380;
      pcVar15 = (char *)0x0;
LAB_0011ed8b:
      annotations = (MOJOSHADER_astAnnotations *)0x0;
LAB_0011fa48:
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
LAB_0011fa4b:
      vll = (MOJOSHADER_astVariableLowLevel *)0x0;
LAB_0011fc02:
      YVar17.yy24 = new_variable_declaration(pCVar4,pMVar21,pcVar15,annotations,pMVar19,vll);
      break;
    case 0x25f:
      local_88 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy24;
      if ((MOJOSHADER_astStructMembers *)local_88.yy8 == (MOJOSHADER_astStructMembers *)0x0) {
        local_88.yy8 = (MOJOSHADER_astPackOffset *)0x0;
      }
      else if ((MOJOSHADER_astStructMembers *)(local_88.yy24)->semantic !=
               (MOJOSHADER_astStructMembers *)0x0) {
        YVar17 = local_88;
        local_88.yy8 = (MOJOSHADER_astPackOffset *)0x0;
        while (YVar23 = YVar17,
              (MOJOSHADER_astStructMembers *)YVar23.yy8 != (MOJOSHADER_astStructMembers *)0x0) {
          local_58[uVar34 - 1].minor = (YYMINORTYPE)(YVar23.yy24)->semantic;
          (YVar23.yy24)->semantic = (char *)local_88;
          local_88 = YVar23;
          YVar17.yy24 = local_58[uVar34 - 1].minor.yy24;
        }
        local_58[uVar34 - 1].minor.yy8 = (MOJOSHADER_astPackOffset *)local_88;
      }
      local_80 = local_58[uVar34 - 3].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x30);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x5c;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)0x0;
        *(YYMINORTYPE *)&(YVar17.yy8)->ident2 = local_80;
        (YVar17.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)local_88;
      }
      break;
    case 0x260:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy306;
      pMVar26 = &pCVar4->dt_none;
      local_90 = YVar17;
      goto LAB_0011fde6;
    case 0x262:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy24;
      YVar23 = YVar17;
      do {
        YVar20 = YVar23;
        YVar23 = (YYMINORTYPE)(YVar20.yy24)->semantic;
      } while (YVar23.yy8 != (MOJOSHADER_astPackOffset *)0x0);
      (YVar20.yy24)->semantic = (char *)local_58[uVar34 - 1].minor;
      break;
    case 0x263:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy346;
      for (YVar23 = YVar17; YVar23.yy8 != (MOJOSHADER_astPackOffset *)0x0;
          YVar23 = (YYMINORTYPE)(YVar23.yy24)->semantic) {
        (YVar23.yy346)->interpolation_mod = local_58[uVar34 - 1].minor.yyinit;
      }
      break;
    case 0x265:
      YVar17 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy346;
      for (YVar23 = YVar17; YVar23.yy8 != (MOJOSHADER_astPackOffset *)0x0;
          YVar23 = (YYMINORTYPE)(YVar23.yy24)->semantic) {
        (YVar23.yy8)->ident1 = (char *)local_58[uVar34 - 2].minor;
      }
      break;
    case 0x266:
      pMVar21 = local_58[uVar34].minor.yy380;
      pcVar15 = (char *)0x0;
      goto LAB_0011f0b7;
    case 0x267:
      pMVar21 = local_58[uVar34 - 1].minor.yy380;
      pcVar15 = local_58[uVar34].minor.yy306;
LAB_0011f0b7:
      YVar17.yy346 = new_struct_member(pCVar4,pMVar21,pcVar15);
      break;
    case 0x268:
      pMVar21 = new_scalar_or_array(pCVar4,local_58[uVar34].minor.yy306,0,
                                    (MOJOSHADER_astExpression *)0x0);
      local_90.yy346 = new_struct_member(pCVar4,pMVar21,(char *)0x0);
      pMVar5 = (MOJOSHADER_astStructMembers *)pyVar12[uVar34 - 2].minor.yy8;
      (local_90.yy346)->next = pMVar5;
      YVar17 = (YYMINORTYPE)pMVar5->semantic;
      goto LAB_0011fea3;
    case 0x269:
      po = local_58[uVar34 - 1].minor.yy8;
      pcVar15 = local_58[uVar34].minor.yy306;
      goto LAB_0011fb94;
    case 0x26a:
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      po = local_58[uVar34].minor.yy8;
      goto LAB_0011fb94;
    case 0x26b:
      po = local_58[uVar34].minor.yy8;
      pcVar15 = (char *)0x0;
      goto LAB_0011fb94;
    case 0x26c:
      pcVar15 = local_58[uVar34].minor.yy306;
      po = (MOJOSHADER_astPackOffset *)0x0;
LAB_0011fb94:
      YVar17.yy82 = new_variable_lowlevel(pCVar4,po,pcVar15);
      break;
    case 0x26d:
      pcVar15 = local_58[uVar34 - 2].minor.yy306;
      iVar14 = 1;
      goto LAB_0011fb66;
    case 0x26e:
      pcVar15 = local_58[uVar34 - 3].minor.yy306;
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
      iVar14 = 1;
      goto LAB_0011fb68;
    case 0x26f:
      pcVar15 = local_58[uVar34].minor.yy306;
      iVar14 = 0;
LAB_0011fb66:
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
LAB_0011fb68:
      YVar17.yy380 = new_scalar_or_array(pCVar4,pcVar15,iVar14,pMVar19);
      break;
    case 0x270:
      pcVar16 = local_58[uVar34 - 3].minor.yy306;
      pcVar15 = local_58[uVar34 - 1].minor.yy306;
      goto LAB_0011f902;
    case 0x271:
      pcVar16 = local_58[uVar34 - 1].minor.yy306;
      pcVar15 = (char *)0x0;
LAB_0011f902:
      YVar17.yy8 = new_pack_offset(pCVar4,pcVar16,pcVar15);
      break;
    case 0x272:
    case 0x278:
    case 0x27a:
    case 0x2ec:
      YVar17 = local_58[uVar34 - 1].minor;
      break;
    case 0x273:
      YVar17 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy24;
      if (YVar17.yy8 == (MOJOSHADER_astPackOffset *)0x0) goto LAB_0011f811;
      if ((YVar17.yy24)->anonymous_datatype != (MOJOSHADER_astStructDeclaration *)0x0) {
        YVar23.yy8 = (MOJOSHADER_astPackOffset *)0x0;
        while (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
          local_58[uVar34 - 1].minor = (YYMINORTYPE)(YVar17.yy24)->anonymous_datatype;
          (YVar17.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)YVar23;
          YVar23 = YVar17;
          YVar17.yy24 = local_58[uVar34 - 1].minor.yy24;
        }
LAB_0011fe0c:
        local_58[uVar34 - 1].minor = YVar23;
        YVar17 = YVar23;
      }
      break;
    case 0x275:
    case 0x2e1:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy24;
      YVar23 = local_58[uVar34 - 1].minor;
LAB_0011fecd:
      (YVar17.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)YVar23;
      break;
    case 0x276:
      local_88 = local_58[uVar34 - 2].minor;
      local_80 = local_58[uVar34 - 1].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x30);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x5a;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)local_88;
        *(YYMINORTYPE *)&(YVar17.yy8)->ident2 = local_80;
        (YVar17.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)0x0;
      }
      break;
    case 0x279:
    case 0x32c:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_COMMA;
      goto LAB_0011f6a7;
    case 0x284:
    case 0x286:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_sampler2d;
      break;
    case 0x285:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_sampler1d;
      break;
    case 0x287:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_sampler3d;
      break;
    case 0x288:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_samplercube;
      break;
    case 0x289:
    case 0x28a:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_samplerstate;
      break;
    case 0x28b:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_samplercompstate;
      break;
    case 0x28c:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_bool;
      break;
    case 0x28d:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_int;
      break;
    case 0x28e:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_uint;
      break;
    case 0x28f:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_half;
      break;
    case 0x290:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_float;
      break;
    case 0x291:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_double;
      break;
    case 0x292:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_string;
      break;
    case 0x293:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_float_snorm;
      break;
    case 0x294:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_float_unorm;
      break;
    case 0x295:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_buf_bool;
      break;
    case 0x296:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_buf_int;
      break;
    case 0x297:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_buf_uint;
      break;
    case 0x298:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_buf_half;
      break;
    case 0x299:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_buf_float;
      break;
    case 0x29a:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_buf_double;
      break;
    case 0x29b:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_buf_float_snorm;
      break;
    case 0x29c:
      YVar17 = (YYMINORTYPE)&pCVar4->dt_buf_float_unorm;
      break;
    case 0x29d:
      YVar17.yy37 = new_datatype_vector(pCVar4,local_58[uVar34 - 3].minor.yy37,
                                        local_58[uVar34 - 1].minor.yyinit);
      break;
    case 0x29e:
      YVar17.yy37 = new_datatype_matrix(pCVar4,local_58[uVar34 - 5].minor.yy37,
                                        local_58[uVar34 - 3].minor.yyinit,
                                        local_58[uVar34 - 1].minor.yyinit);
      break;
    case 0x29f:
      pMVar31 = (MOJOSHADER_astStatement *)0x0;
      goto LAB_0011ff58;
    case 0x2a0:
      pMVar31 = local_58[uVar34 - 1].minor.yy233;
      if (pMVar31 == (MOJOSHADER_astStatement *)0x0) {
        pMVar31 = (MOJOSHADER_astStatement *)0x0;
      }
      else if (pMVar31->next != (MOJOSHADER_astStatement *)0x0) {
        pMVar35 = pMVar31;
        pMVar31 = (MOJOSHADER_astStatement *)0x0;
        while (pMVar22 = pMVar35, pMVar22 != (MOJOSHADER_astStatement *)0x0) {
          local_58[uVar34 - 1].minor = (YYMINORTYPE)pMVar22->next;
          pMVar22->next = pMVar31;
          pMVar31 = pMVar22;
          pMVar35 = local_58[uVar34 - 1].minor.yy233;
        }
        local_58[uVar34 - 1].minor.yy233 = pMVar31;
      }
LAB_0011ff58:
      YVar17.yy233 = new_block_statement(pCVar4,pMVar31);
      break;
    case 0x2a2:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy8;
      (YVar17.yy8)->ident1 = (char *)local_58[uVar34 - 1].minor;
      break;
    case 0x2a3:
    case 0x2a4:
    case 0x2a5:
    case 0x2a6:
    case 0x2a7:
    case 0x2a8:
    case 0x2bd:
    case 0x2c2:
    case 0x2d2:
    case 0x2da:
    case 0x2df:
      local_90.yy8 = (MOJOSHADER_astPackOffset *)0x0;
      YVar17.yy8 = local_90.yy8;
      break;
    case 0x2a9:
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x20);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x44;
LAB_0011fa14:
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)0x0;
      }
      break;
    case 0x2aa:
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x20);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x45;
        goto LAB_0011fa14;
      }
      break;
    case 0x2ab:
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x20);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x46;
        goto LAB_0011fa14;
      }
      break;
    case 0x2ac:
      YVar17 = local_58[uVar34].minor;
      local_58[uVar34 - 2].minor.yyinit = 0;
      break;
    case 0x2ad:
      local_88 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x51;
        goto LAB_0011fc52;
      }
      break;
    case 0x2ae:
      local_88 = local_58[uVar34 - 1].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x50;
        goto LAB_0011fc52;
      }
      break;
    case 0x2af:
      local_80.yyinit = local_58[uVar34 - 7].minor.yyinit;
      local_88 = local_58[uVar34 - 5].minor;
      local_78 = local_58[uVar34 - 2].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x38);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x4c;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)0x0;
        ((MOJOSHADER_astDataType *)&(YVar17.yy71)->isconst)->type = local_80._0_4_;
        (YVar17.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)local_78;
        YVar23 = local_88;
LAB_0011ff42:
        (YVar17.yy24)->details = (MOJOSHADER_astScalarOrArray *)YVar23;
      }
      break;
    case 0x2b0:
      local_88.yyinit = local_58[uVar34 - 4].minor.yyinit;
      local_80 = local_58[uVar34 - 2].minor;
      local_78 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x38);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x4d;
LAB_0011ff17:
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)0x0;
        ((MOJOSHADER_astDataType *)&(YVar17.yy71)->isconst)->type = local_88._0_4_;
LAB_0011ff34:
        (YVar17.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)local_80;
        YVar23 = local_78;
        goto LAB_0011ff42;
      }
      break;
    case 0x2b1:
      iVar14 = local_58[uVar34 - 4].minor.yyinit;
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
      pMVar35 = (MOJOSHADER_astStatement *)0x0;
      goto LAB_0011f836;
    case 0x2b2:
      iVar14 = local_58[uVar34 - 6].minor.yyinit;
      pMVar19 = local_58[uVar34 - 4].minor.yy322;
      pMVar31 = local_58[uVar34 - 2].minor.yy233;
      pMVar35 = local_58[uVar34].minor.yy233;
LAB_0011f836:
      YVar17.yy233 = new_if_statement(pCVar4,iVar14,pMVar19,pMVar31,pMVar35);
      break;
    case 0x2b3:
      local_78 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy24;
      if ((MOJOSHADER_astStructDeclaration *)local_78.yy8 == (MOJOSHADER_astStructDeclaration *)0x0)
      {
        local_78.yy8 = (MOJOSHADER_astPackOffset *)0x0;
      }
      else if ((MOJOSHADER_astStructMembers *)(local_78.yy24)->anonymous_datatype !=
               (MOJOSHADER_astStructMembers *)0x0) {
        YVar17 = local_78;
        local_78.yy8 = (MOJOSHADER_astPackOffset *)0x0;
        while (YVar23 = YVar17,
              (MOJOSHADER_astStructDeclaration *)YVar23.yy8 !=
              (MOJOSHADER_astStructDeclaration *)0x0) {
          local_58[uVar34 - 1].minor = (YYMINORTYPE)(YVar23.yy24)->anonymous_datatype;
          (YVar23.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)local_78;
          local_78 = YVar23;
          YVar17.yy24 = local_58[uVar34 - 1].minor.yy24;
        }
        local_58[uVar34 - 1].minor.yy8 = (MOJOSHADER_astPackOffset *)local_78;
      }
      local_88.yyinit = local_58[uVar34 - 6].minor.yyinit;
      local_80 = local_58[uVar34 - 4].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x38);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x4a;
        goto LAB_0011ff17;
      }
      break;
    case 0x2b4:
      local_88 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x4f;
        goto LAB_0011fc52;
      }
      break;
    case 0x2b5:
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x20);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x43;
        goto LAB_0011fa14;
      }
      break;
    case 0x2b6:
      local_88 = local_58[uVar34 - 1].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x48;
        goto LAB_0011fc52;
      }
      break;
    case 0x2b7:
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011f8d3;
    case 0x2b8:
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
LAB_0011f8d3:
      YVar17.yy233 = new_return_statement(pCVar4,pMVar19);
      break;
    case 699:
    case 0x2c0:
    case 0x2d0:
      local_90.yyinit = MOJOSHADER_AST_INPUTMOD_NONE;
      if (0 < (long)local_58[uVar34 - 3].minor.yy8) {
        local_90.yyinit = local_58[uVar34 - 3].minor.yy75;
      }
      local_90._4_4_ = 0;
      YVar17 = local_90;
      break;
    case 700:
    case 0x2c1:
    case 0x2d1:
      local_90 = (YYMINORTYPE)0xffffffff;
      YVar17 = local_90;
      break;
    case 0x2be:
    case 0x2c3:
    case 0x2d3:
      local_90 = (YYMINORTYPE)0xfffffffe;
      YVar17 = local_90;
      break;
    case 0x2bf:
      YVar17 = (YYMINORTYPE)local_58[uVar34].minor.yy71;
      ((MOJOSHADER_astDataType *)&(YVar17.yy71)->isconst)->type = local_58[uVar34 - 1].minor.yyinit;
      break;
    case 0x2c4:
      initializer = local_58[uVar34 - 6].minor.yy322;
      pMVar19 = local_58[uVar34 - 4].minor.yy322;
      pMVar30 = local_58[uVar34 - 2].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
      decl = (MOJOSHADER_astVariableDeclaration *)0x0;
      goto LAB_0011f8ef;
    case 0x2c5:
      pMVar31 = local_58[uVar34].minor.yy233;
      decl = (MOJOSHADER_astVariableDeclaration *)0x0;
      goto LAB_0011f8e8;
    case 0x2c6:
      pMVar30 = local_58[uVar34 - 2].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
      initializer = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011f058;
    case 0x2c7:
      pMVar19 = local_58[uVar34 - 3].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
      decl = (MOJOSHADER_astVariableDeclaration *)0x0;
      goto LAB_0011f84d;
    case 0x2c8:
      pMVar19 = local_58[uVar34 - 4].minor.yy322;
      pMVar30 = local_58[uVar34 - 2].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
      decl = (MOJOSHADER_astVariableDeclaration *)0x0;
      goto LAB_0011f7d3;
    case 0x2c9:
      initializer = local_58[uVar34 - 4].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
      decl = (MOJOSHADER_astVariableDeclaration *)0x0;
      goto LAB_0011f8ea;
    case 0x2ca:
      initializer = local_58[uVar34 - 5].minor.yy322;
      pMVar30 = local_58[uVar34 - 2].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
LAB_0011f058:
      decl = (MOJOSHADER_astVariableDeclaration *)0x0;
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011f8ef;
    case 0x2cb:
      initializer = local_58[uVar34 - 5].minor.yy322;
      pMVar19 = local_58[uVar34 - 3].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
      decl = (MOJOSHADER_astVariableDeclaration *)0x0;
      goto LAB_0011f8ec;
    case 0x2cc:
      decl = local_58[uVar34 - 5].minor.yy24;
      pMVar19 = local_58[uVar34 - 4].minor.yy322;
      pMVar30 = local_58[uVar34 - 2].minor.yy322;
      pMVar31 = local_58[uVar34].minor.yy233;
LAB_0011f7d3:
      initializer = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011f8ef;
    case 0x2cd:
      decl = local_58[uVar34 - 3].minor.yy24;
      pMVar31 = local_58[uVar34].minor.yy233;
LAB_0011f8e8:
      initializer = (MOJOSHADER_astExpression *)0x0;
LAB_0011f8ea:
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
LAB_0011f8ec:
      pMVar30 = (MOJOSHADER_astExpression *)0x0;
LAB_0011f8ef:
      YVar17.yy233 = new_for_statement(pCVar4,decl,initializer,pMVar19,pMVar30,pMVar31);
      break;
    case 0x2ce:
      decl = local_58[uVar34 - 4].minor.yy24;
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      goto LAB_0011f11b;
    case 0x2cf:
      decl = local_58[uVar34 - 4].minor.yy24;
      pMVar19 = local_58[uVar34 - 3].minor.yy322;
LAB_0011f11b:
      pMVar31 = local_58[uVar34].minor.yy233;
LAB_0011f84d:
      initializer = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011f8ec;
    case 0x2d9:
      local_90 = (YYMINORTYPE)0x6;
      YVar17 = local_90;
      break;
    case 0x2e2:
      pMVar31 = local_58[uVar34].minor.yy233;
      if (pMVar31 == (MOJOSHADER_astStatement *)0x0) {
        pMVar31 = (MOJOSHADER_astStatement *)0x0;
      }
      else if (pMVar31->next != (MOJOSHADER_astStatement *)0x0) {
        pMVar35 = pMVar31;
        pMVar31 = (MOJOSHADER_astStatement *)0x0;
        while (pMVar22 = pMVar35, pMVar22 != (MOJOSHADER_astStatement *)0x0) {
          local_58[uVar34].minor = (YYMINORTYPE)pMVar22->next;
          pMVar22->next = pMVar31;
          pMVar31 = pMVar22;
          pMVar35 = local_58[uVar34].minor.yy233;
        }
        local_58[uVar34].minor.yy233 = pMVar31;
      }
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      goto LAB_0011ff69;
    case 0x2e3:
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
      goto LAB_0011f7ac;
    case 0x2e4:
      pMVar31 = local_58[uVar34].minor.yy233;
      if (pMVar31 == (MOJOSHADER_astStatement *)0x0) {
        pMVar31 = (MOJOSHADER_astStatement *)0x0;
      }
      else if (pMVar31->next != (MOJOSHADER_astStatement *)0x0) {
        pMVar35 = pMVar31;
        pMVar31 = (MOJOSHADER_astStatement *)0x0;
        while (pMVar22 = pMVar35, pMVar22 != (MOJOSHADER_astStatement *)0x0) {
          local_58[uVar34].minor = (YYMINORTYPE)pMVar22->next;
          pMVar22->next = pMVar31;
          pMVar31 = pMVar22;
          pMVar35 = local_58[uVar34].minor.yy233;
        }
        local_58[uVar34].minor.yy233 = pMVar31;
      }
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
      goto LAB_0011ff69;
    case 0x2e5:
      pMVar19 = (MOJOSHADER_astExpression *)0x0;
LAB_0011f7ac:
      pMVar31 = (MOJOSHADER_astStatement *)0x0;
LAB_0011ff69:
      YVar17.yy165 = new_switch_case(pCVar4,pMVar19,pMVar31);
      break;
    case 0x2e6:
      YVar17.yy322 = new_identifier_expr(pCVar4,local_58[uVar34].minor.yy306);
      break;
    case 0x2e7:
      YVar17.yy322 = new_literal_int_expr(pCVar4,local_58[uVar34].minor.yyinit);
      break;
    case 0x2e8:
      local_88 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x32;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)&pCVar4->dt_float;
        *(YYMINORTYPE *)&(YVar17.yy8)->ident2 = local_88;
      }
      break;
    case 0x2e9:
      local_88 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x33;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)&pCVar4->dt_string;
        YVar23 = local_88;
        goto LAB_0011fc6d;
      }
      break;
    case 0x2ea:
      iVar14 = 1;
      goto LAB_0011f7b8;
    case 0x2eb:
      iVar14 = 0;
LAB_0011f7b8:
      YVar17.yy322 = new_literal_boolean_expr(pCVar4,iVar14);
      break;
    case 0x2ee:
      pMVar19 = local_58[uVar34 - 3].minor.yy322;
      pMVar30 = local_58[uVar34 - 1].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_DEREF_ARRAY;
      goto LAB_0011f6a7;
    case 0x2ef:
      local_78 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy306;
      local_80 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x30);
      if ((MOJOSHADER_astStructDeclaration *)YVar17.yy8 != (MOJOSHADER_astStructDeclaration *)0x0) {
        ((YVar17.yy8)->ast).type = 0x38;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        local_88.yy8 = YVar17.yy8;
        pMVar19 = new_identifier_expr(pCVar4,local_78.yy306);
        (local_88.yy8)->ident1 = (char *)0x0;
        *(MOJOSHADER_astExpression **)&(local_88.yy268)->initializer = pMVar19;
        (local_88.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)local_80;
        YVar17 = local_88;
      }
      break;
    case 0x2f0:
      local_88 = local_58[uVar34 - 1].minor;
      local_80 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x28);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x39;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)local_88;
        YVar23 = local_80;
        goto LAB_0011fc6d;
      }
      break;
    case 0x2f1:
      local_88 = local_58[uVar34 - 2].minor;
      local_80 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x38);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x37;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)0x0;
        *(YYMINORTYPE *)&(YVar17.yy8)->ident2 = local_88;
        (YVar17.yy24)->anonymous_datatype = (MOJOSHADER_astStructDeclaration *)local_80;
        (YVar17.yy24)->details = (MOJOSHADER_astScalarOrArray *)0x0;
      }
      break;
    case 0x2f2:
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_POSTINCREMENT;
      goto LAB_0011f52e;
    case 0x2f3:
      pMVar19 = local_58[uVar34 - 1].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_POSTDECREMENT;
      goto LAB_0011f52e;
    case 0x2f5:
      YVar17 = (YYMINORTYPE)local_58[uVar34 - 1].minor.yy8;
      if (YVar17.yy8 == (MOJOSHADER_astPackOffset *)0x0) goto LAB_0011f811;
      if (*(long *)&(YVar17.yy8)->ident2 != 0) {
        YVar23.yy8 = (MOJOSHADER_astPackOffset *)0x0;
        while (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
          local_58[uVar34 - 1].minor = *(YYMINORTYPE *)&(YVar17.yy8)->ident2;
          *(YYMINORTYPE *)&(YVar17.yy8)->ident2 = (MOJOSHADER_astPackOffset *)YVar23;
          YVar23 = YVar17;
          YVar17.yy8 = local_58[uVar34 - 1].minor.yy8;
        }
        goto LAB_0011fe0c;
      }
      break;
    case 0x2f6:
      YVar17.yy26 = new_argument(pCVar4,local_58[uVar34].minor.yy322);
      break;
    case 0x2f7:
      local_90.yy26 = new_argument(pCVar4,local_58[uVar34].minor.yy322);
LAB_0011fe9f:
      YVar17 = pyVar12[uVar34 - 2].minor;
LAB_0011fea3:
      *(YYMINORTYPE *)&(local_90.yy8)->ident2 = YVar17;
      YVar17 = local_90;
      break;
    case 0x2f9:
      pMVar19 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_PREINCREMENT;
      goto LAB_0011f52e;
    case 0x2fa:
      pMVar19 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_PREDECREMENT;
      goto LAB_0011f52e;
    case 0x2fc:
      pMVar19 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_NEGATE;
      goto LAB_0011f52e;
    case 0x2fd:
      pMVar19 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_COMPLEMENT;
      goto LAB_0011f52e;
    case 0x2fe:
      pMVar19 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_NOT;
LAB_0011f52e:
      YVar17.yy322 = new_unary_expr(pCVar4,MVar8,pMVar19);
      break;
    case 0x300:
      YVar17.yy322 = new_cast_expr(pCVar4,local_58[uVar34 - 2].minor.yy37,
                                   local_58[uVar34].minor.yy322);
      break;
    case 0x302:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_MULTIPLY;
      goto LAB_0011f6a7;
    case 0x303:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_DIVIDE;
      goto LAB_0011f6a7;
    case 0x304:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_MODULO;
      goto LAB_0011f6a7;
    case 0x306:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_ADD;
      goto LAB_0011f6a7;
    case 0x307:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_SUBTRACT;
      goto LAB_0011f6a7;
    case 0x309:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_LSHIFT;
      goto LAB_0011f6a7;
    case 0x30a:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_RSHIFT;
      goto LAB_0011f6a7;
    case 0x30c:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_LESSTHAN;
      goto LAB_0011f6a7;
    case 0x30d:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_GREATERTHAN;
      goto LAB_0011f6a7;
    case 0x30e:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_LESSTHANOREQUAL;
      goto LAB_0011f6a7;
    case 0x30f:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_GREATERTHANOREQUAL;
      goto LAB_0011f6a7;
    case 0x311:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_EQUAL;
      goto LAB_0011f6a7;
    case 0x312:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_NOTEQUAL;
      goto LAB_0011f6a7;
    case 0x314:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_BINARYAND;
      goto LAB_0011f6a7;
    case 0x316:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_BINARYXOR;
      goto LAB_0011f6a7;
    case 0x318:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_BINARYOR;
      goto LAB_0011f6a7;
    case 0x31a:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_LOGICALAND;
      goto LAB_0011f6a7;
    case 0x31c:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_LOGICALOR;
      goto LAB_0011f6a7;
    case 0x31e:
      local_88 = local_58[uVar34 - 4].minor;
      local_80 = local_58[uVar34 - 2].minor;
      local_78 = local_58[uVar34].minor;
      YVar17.yy8 = (MOJOSHADER_astPackOffset *)Malloc(pCVar4,0x38);
      if (YVar17.yy8 != (MOJOSHADER_astPackOffset *)0x0) {
        ((YVar17.yy8)->ast).type = 0x2d;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).base =
             (MOJOSHADER_astDataType *)pCVar4->sourcefile;
        (((MOJOSHADER_astDataType *)&(YVar17.yy8)->ast)->array).elements = pCVar4->sourceline;
        (YVar17.yy8)->ident1 = (char *)&pCVar4->dt_bool;
        *(YYMINORTYPE *)&(YVar17.yy8)->ident2 = local_88;
        goto LAB_0011ff34;
      }
      break;
    case 800:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_ASSIGN;
      goto LAB_0011f6a7;
    case 0x321:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_MULASSIGN;
      goto LAB_0011f6a7;
    case 0x322:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_DIVASSIGN;
      goto LAB_0011f6a7;
    case 0x323:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_MODASSIGN;
      goto LAB_0011f6a7;
    case 0x324:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_ADDASSIGN;
      goto LAB_0011f6a7;
    case 0x325:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_SUBASSIGN;
      goto LAB_0011f6a7;
    case 0x326:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_LSHIFTASSIGN;
      goto LAB_0011f6a7;
    case 0x327:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_RSHIFTASSIGN;
      goto LAB_0011f6a7;
    case 0x328:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_ANDASSIGN;
      goto LAB_0011f6a7;
    case 0x329:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_XORASSIGN;
      goto LAB_0011f6a7;
    case 0x32a:
      pMVar19 = local_58[uVar34 - 2].minor.yy322;
      pMVar30 = local_58[uVar34].minor.yy322;
      MVar8 = MOJOSHADER_AST_OP_ORASSIGN;
LAB_0011f6a7:
      YVar17.yy322 = new_binary_expr(pCVar4,MVar8,pMVar19,pMVar30);
    }
    goto LAB_0011ff73;
  }
  goto LAB_001209e8;
switchD_0011ea2c_caseD_20e:
  YVar17 = local_58[uVar34].minor;
LAB_0011ff73:
  local_90 = YVar17;
  _ctx = local_60;
  bVar1 = yyRuleInfo[uVar27 - 0x20d].lhs;
  bVar2 = yyRuleInfo[uVar27 - 0x20d].nrhs;
  iVar14 = yypParser->yyidx - (uint)bVar2;
  yypParser->yyidx = iVar14;
  if (0x90 < (ulong)pyVar12[uVar34 - bVar2].stateno) {
    __assert_fail("stateno<=YY_REDUCE_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                  ,0x918,"int yy_find_reduce_action(int, unsigned char)");
  }
  if (bVar1 == 0xc6) {
    __assert_fail("iLookAhead!=YYNOCODE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                  ,0x91c,"int yy_find_reduce_action(int, unsigned char)");
  }
  uVar27 = (int)yy_reduce_ofst[pyVar12[uVar34 - bVar2].stateno] + (uint)bVar1;
  if (0x151e < uVar27) {
    __assert_fail("i>=0 && i<YY_ACTTAB_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                  ,0x923,"int yy_find_reduce_action(int, unsigned char)");
  }
  if (yy_lookahead[uVar27] != bVar1) {
    __assert_fail("yy_lookahead[i]==iLookAhead",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                  ,0x924,"int yy_find_reduce_action(int, unsigned char)");
  }
  uVar3 = yy_action[uVar27];
  if (uVar3 < 0x20d) {
    yy_shift(yypParser,(uint)uVar3,(uint)bVar1,&local_90);
  }
  else {
    if (uVar3 != 0x32e) {
      __assert_fail("yyact == YYNSTATE + YYNRULE + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_parser_hlsl.h"
                    ,0xfc3,"void yy_reduce(yyParser *, int)");
    }
    pCVar4 = yypParser->ctx;
    while (-1 < iVar14) {
      yy_pop_parser_stack(yypParser);
      iVar14 = yypParser->yyidx;
    }
    yypParser->ctx = pCVar4;
  }
  uVar27 = yypParser->yyidx;
  if ((int)uVar27 < 0) goto LAB_00120133;
  goto LAB_0011e997;
LAB_00120133:
  bVar9 = false;
  if (yyMajor == 0x42) {
    pop_scope(ctx);
    uVar13 = local_68;
  }
  else {
    uVar13 = local_68;
    if (yyMajor == 0x41) {
      push_scope(ctx);
      uVar13 = local_68;
    }
  }
LAB_0011e717:
  local_68 = uVar13;
  map = local_40;
  pSVar10 = local_48;
  if (tokenval == TOKEN_EOI) {
LAB_001209e8:
    while ((ctx->usertypes).scope != pSVar10) {
      pop_symbol(ctx,map);
    }
    p_Var6 = ctx->free;
    pvVar7 = ctx->malloc_data;
    while (-1 < yypParser->yyidx) {
      yy_pop_parser_stack(yypParser);
    }
    (*p_Var6)(yypParser,pvVar7);
    preprocessor_end(_ctx);
    return;
  }
  goto LAB_0011e6a9;
}

Assistant:

static void parse_source(Context *ctx, const char *filename,
                         const char *source, unsigned int sourcelen,
                         const MOJOSHADER_preprocessorDefine *defines,
                         unsigned int define_count,
                         MOJOSHADER_includeOpen include_open,
                         MOJOSHADER_includeClose include_close)
{
    TokenData data;
    unsigned int tokenlen;
    Token tokenval;
    const char *token;
    int lemon_token;
    const char *fname;
    Preprocessor *pp;
    void *parser;

    if (!include_open) include_open = MOJOSHADER_internal_include_open;
    if (!include_close) include_close = MOJOSHADER_internal_include_close;

    pp = preprocessor_start(filename, source, sourcelen, include_open,
                            include_close, defines, define_count, 0,
                            MallocBridge, FreeBridge, ctx);
    if (pp == NULL)
    {
        assert(ctx->out_of_memory);  // shouldn't fail for any other reason.
        return;
    } // if

    parser = ParseHLSLAlloc(ctx->malloc, ctx->malloc_data);
    if (parser == NULL)
    {
        assert(ctx->out_of_memory);  // shouldn't fail for any other reason.
        preprocessor_end(pp);
        return;
    } // if

    // !!! FIXME: check if (parser == NULL)...

    init_builtins(ctx);

    SymbolScope *start_scope = ctx->usertypes.scope;

    #if DEBUG_COMPILER_PARSER
    ParseHLSLTrace(stdout, "COMPILER: ");
    #endif

    // Run the preprocessor/lexer/parser...
    int is_pragma = 0;   // !!! FIXME: remove this later when we can parse #pragma.
    int skipping = 0; // !!! FIXME: remove this later when we can parse #pragma.
    do {
        token = preprocessor_nexttoken(pp, &tokenlen, &tokenval);

        if (ctx->out_of_memory)
            break;

        fname = preprocessor_sourcepos(pp, &ctx->sourceline);
        ctx->sourcefile = fname ? stringcache(ctx->strcache, fname) : 0;

        if ((tokenval == TOKEN_HASH) || (tokenval == TOKEN_HASHHASH))
            tokenval = TOKEN_BAD_CHARS;

        if (tokenval == TOKEN_BAD_CHARS)
        {
            fail(ctx, "Bad characters in source file");
            continue;
        } // else if

        else if (tokenval == TOKEN_PREPROCESSING_ERROR)
        {
            fail(ctx, token);  // this happens to be null-terminated.
            continue;
        } // else if

        else if (tokenval == TOKEN_PP_PRAGMA)
        {
            assert(!is_pragma);
            is_pragma = 1;
            skipping = 1;
            continue;
        }

        else if (tokenval == ((Token) '\n'))
        {
            assert(is_pragma);
            is_pragma = 0;
            skipping = 0;
            continue;
        }

        else if (skipping)
        {
            continue;
        }

        // !!! FIXME: this is a mess, decide who should be doing this stuff, and only do it once.
        lemon_token = convert_to_lemon_token(ctx, token, tokenlen, tokenval);
        switch (lemon_token)
        {
            case TOKEN_HLSL_INT_CONSTANT:
                data.i64 = strtoi64(token, tokenlen);
                break;

            case TOKEN_HLSL_FLOAT_CONSTANT:
                data.dbl = strtodouble(token, tokenlen);
                break;

            case TOKEN_HLSL_USERTYPE:
                data.string = stringcache_len(ctx->strcache, token, tokenlen);
                data.datatype = get_usertype(ctx, data.string);  // !!! FIXME: do we need this? It's kind of useless during parsing.
                assert(data.datatype != NULL);
                break;

            case TOKEN_HLSL_STRING_LITERAL:
            case TOKEN_HLSL_IDENTIFIER:
                data.string = stringcache_len(ctx->strcache, token, tokenlen);
                break;

            default:
                data.i64 = 0;
                break;
        } // switch

        ParseHLSL(parser, lemon_token, data, ctx);

        // this probably isn't perfect, but it's good enough for surviving
        //  the parse. We'll sort out correctness once we have a tree.
        if (lemon_token == TOKEN_HLSL_LBRACE)
            push_scope(ctx);
        else if (lemon_token == TOKEN_HLSL_RBRACE)
            pop_scope(ctx);
    } while (tokenval != TOKEN_EOI);

    // Clean out extra usertypes; they are dummies until semantic analysis.
    while (ctx->usertypes.scope != start_scope)
        pop_symbol(ctx, &ctx->usertypes);

    ParseHLSLFree(parser, ctx->free, ctx->malloc_data);
    preprocessor_end(pp);
}